

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse2.cpp
# Opt level: O2

void comp_func_SourceOver_sse2(uint *destPixels,uint *srcPixels,int length,uint const_alpha)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  int _i;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 (*pauVar9) [16];
  int _i_1;
  short sVar10;
  short sVar12;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  ushort uVar14;
  undefined1 auVar15 [12];
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar27;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ushort uVar26;
  ushort uVar28;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ushort uVar34;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  undefined1 auVar35 [16];
  undefined1 auVar20 [16];
  
  if (const_alpha == 0xff) {
    uVar7 = (ulong)length;
    uVar8 = (ulong)(-((uint)((ulong)destPixels >> 2) & 0x3fffffff) & 3);
    if (uVar7 <= uVar8) {
      uVar8 = uVar7;
    }
    iVar3 = 0xff;
    for (uVar6 = 0; auVar2 = _DAT_0060d700, auVar1 = _DAT_0060d6f0, auVar11 = _DAT_005c6ba0,
        (uint)((int)uVar8 * 4) != uVar6; uVar6 = uVar6 + 4) {
      blend_pixel((quint32 *)((long)destPixels + uVar6),*(quint32 *)((long)srcPixels + uVar6));
    }
    pauVar9 = (undefined1 (*) [16])(destPixels + uVar8);
    for (; (long)uVar8 < (long)(length + -3); uVar8 = uVar8 + 4) {
      auVar13 = *(undefined1 (*) [16])(srcPixels + uVar8);
      auVar16 = auVar13 ^ auVar11;
      auVar29._0_4_ = -(uint)(0x7effffff < auVar16._0_4_);
      auVar29._4_4_ = -(uint)(0x7effffff < auVar16._4_4_);
      auVar29._8_4_ = -(uint)(0x7effffff < auVar16._8_4_);
      auVar29._12_4_ = -(uint)(0x7effffff < auVar16._12_4_);
      iVar3 = movmskps(iVar3,auVar29);
      if (iVar3 == 0xf) {
        *pauVar9 = auVar13;
        iVar3 = 0xf;
      }
      else {
        auVar17._0_4_ = -(uint)(-0x7f000001 < auVar16._0_4_);
        auVar17._4_4_ = -(uint)(-0x7f000001 < auVar16._4_4_);
        auVar17._8_4_ = -(uint)(-0x7f000001 < auVar16._8_4_);
        auVar17._12_4_ = -(uint)(-0x7f000001 < auVar16._12_4_);
        iVar3 = movmskps(iVar3,auVar17);
        if (iVar3 != 0) {
          auVar18._0_4_ = auVar13._0_4_ >> 0x18;
          auVar18._4_4_ = auVar13._4_4_ >> 0x18;
          auVar18._8_4_ = auVar13._8_4_ >> 0x18;
          auVar18._12_4_ = auVar13._12_4_ >> 0x18;
          auVar30._0_4_ = auVar18._0_4_ << 0x10;
          auVar30._4_4_ = auVar18._4_4_ << 0x10;
          auVar30._8_4_ = auVar18._8_4_ << 0x10;
          auVar30._12_4_ = auVar18._12_4_ << 0x10;
          auVar31 = (auVar30 | auVar18) ^ auVar1;
          auVar16 = *pauVar9;
          uVar34 = (auVar16._0_2_ >> 8) * auVar31._0_2_;
          uVar36 = (auVar16._2_2_ >> 8) * auVar31._2_2_;
          uVar37 = (auVar16._4_2_ >> 8) * auVar31._4_2_;
          uVar38 = (auVar16._6_2_ >> 8) * auVar31._6_2_;
          uVar39 = (auVar16._8_2_ >> 8) * auVar31._8_2_;
          uVar40 = (auVar16._10_2_ >> 8) * auVar31._10_2_;
          uVar41 = (auVar16._12_2_ >> 8) * auVar31._12_2_;
          uVar42 = (auVar16._14_2_ >> 8) * auVar31._14_2_;
          auVar16 = auVar16 & auVar1;
          uVar14 = auVar16._0_2_ * auVar31._0_2_;
          uVar22 = auVar16._2_2_ * auVar31._2_2_;
          uVar23 = auVar16._4_2_ * auVar31._4_2_;
          uVar24 = auVar16._6_2_ * auVar31._6_2_;
          uVar25 = auVar16._8_2_ * auVar31._8_2_;
          uVar26 = auVar16._10_2_ * auVar31._10_2_;
          uVar27 = auVar16._12_2_ * auVar31._12_2_;
          uVar28 = auVar16._14_2_ * auVar31._14_2_;
          auVar35._0_2_ = uVar34 + 0x80 + (uVar34 >> 8);
          auVar35._2_2_ = uVar36 + 0x80 + (uVar36 >> 8);
          auVar35._4_2_ = uVar37 + 0x80 + (uVar37 >> 8);
          auVar35._6_2_ = uVar38 + 0x80 + (uVar38 >> 8);
          auVar35._8_2_ = uVar39 + 0x80 + (uVar39 >> 8);
          auVar35._10_2_ = uVar40 + 0x80 + (uVar40 >> 8);
          auVar35._12_2_ = uVar41 + 0x80 + (uVar41 >> 8);
          auVar35._14_2_ = uVar42 + 0x80 + (uVar42 >> 8);
          auVar19._0_2_ = (ushort)(uVar14 + 0x80 + (uVar14 >> 8)) >> 8;
          auVar19._2_2_ = (ushort)(uVar22 + 0x80 + (uVar22 >> 8)) >> 8;
          auVar19._4_2_ = (ushort)(uVar23 + 0x80 + (uVar23 >> 8)) >> 8;
          auVar19._6_2_ = (ushort)(uVar24 + 0x80 + (uVar24 >> 8)) >> 8;
          auVar19._8_2_ = (ushort)(uVar25 + 0x80 + (uVar25 >> 8)) >> 8;
          auVar19._10_2_ = (ushort)(uVar26 + 0x80 + (uVar26 >> 8)) >> 8;
          auVar19._12_2_ = (ushort)(uVar27 + 0x80 + (uVar27 >> 8)) >> 8;
          auVar19._14_2_ = (ushort)(uVar28 + 0x80 + (uVar28 >> 8)) >> 8;
          auVar19 = auVar19 | auVar35 & auVar2;
          (*pauVar9)[0] = auVar19[0] + auVar13[0];
          (*pauVar9)[1] = auVar19[1] + auVar13[1];
          (*pauVar9)[2] = auVar19[2] + auVar13[2];
          (*pauVar9)[3] = auVar19[3] + auVar13[3];
          (*pauVar9)[4] = auVar19[4] + auVar13[4];
          (*pauVar9)[5] = auVar19[5] + auVar13[5];
          (*pauVar9)[6] = auVar19[6] + auVar13[6];
          (*pauVar9)[7] = auVar19[7] + auVar13[7];
          (*pauVar9)[8] = auVar19[8] + auVar13[8];
          (*pauVar9)[9] = auVar19[9] + auVar13[9];
          (*pauVar9)[10] = auVar19[10] + auVar13[10];
          (*pauVar9)[0xb] = auVar19[0xb] + auVar13[0xb];
          (*pauVar9)[0xc] = auVar19[0xc] + auVar13[0xc];
          (*pauVar9)[0xd] = auVar19[0xd] + auVar13[0xd];
          (*pauVar9)[0xe] = auVar19[0xe] + auVar13[0xe];
          (*pauVar9)[0xf] = auVar19[0xf] + auVar13[0xf];
        }
      }
      pauVar9 = pauVar9 + 1;
    }
    uVar5 = 0;
    for (; (uVar5 < 3 && ((long)uVar8 < (long)uVar7)); uVar8 = uVar8 + 1) {
      blend_pixel((quint32 *)pauVar9,srcPixels[uVar8]);
      uVar5 = uVar5 + 1;
      pauVar9 = (undefined1 (*) [16])(*pauVar9 + 4);
    }
  }
  else {
    uVar7 = (ulong)length;
    uVar8 = (ulong)(-((uint)((ulong)destPixels >> 2) & 0x3fffffff) & 3);
    if (uVar7 <= uVar8) {
      uVar8 = uVar7;
    }
    uVar4 = const_alpha;
    auVar11 = ZEXT416(const_alpha);
    for (uVar6 = 0; auVar2 = _DAT_0060d700, auVar1 = _DAT_0060d6f0, (uint)((int)uVar8 * 4) != uVar6;
        uVar6 = uVar6 + 4) {
      blend_pixel((quint32 *)((long)destPixels + uVar6),*(quint32 *)((long)srcPixels + uVar6),
                  const_alpha);
      auVar11 = extraout_XMM0;
    }
    auVar11 = pshuflw(auVar11,ZEXT416(const_alpha),0);
    pauVar9 = (undefined1 (*) [16])(destPixels + uVar8);
    for (; (long)uVar8 < (long)(length + -3); uVar8 = uVar8 + 4) {
      auVar13 = *(undefined1 (*) [16])(srcPixels + uVar8);
      auVar16._0_4_ = -(uint)(auVar13._0_4_ == 0);
      auVar16._4_4_ = -(uint)(auVar13._4_4_ == 0);
      auVar16._8_4_ = -(uint)(auVar13._8_4_ == 0);
      auVar16._12_4_ = -(uint)(auVar13._12_4_ == 0);
      uVar4 = movmskps(uVar4,auVar16);
      if (uVar4 != 0xf) {
        sVar10 = auVar11._0_2_;
        uVar36 = (auVar13._0_2_ >> 8) * sVar10;
        sVar12 = auVar11._2_2_;
        uVar14 = (auVar13._2_2_ >> 8) * sVar12;
        uVar37 = (auVar13._4_2_ >> 8) * sVar10;
        uVar38 = (auVar13._6_2_ >> 8) * sVar12;
        uVar39 = (auVar13._8_2_ >> 8) * sVar10;
        uVar40 = (auVar13._10_2_ >> 8) * sVar12;
        uVar41 = (auVar13._12_2_ >> 8) * sVar10;
        uVar42 = (auVar13._14_2_ >> 8) * sVar12;
        auVar13 = auVar13 & auVar1;
        uVar22 = auVar13._0_2_ * sVar10;
        uVar23 = auVar13._2_2_ * sVar12;
        uVar24 = auVar13._4_2_ * sVar10;
        uVar25 = auVar13._6_2_ * sVar12;
        uVar26 = auVar13._8_2_ * sVar10;
        uVar27 = auVar13._10_2_ * sVar12;
        uVar28 = auVar13._12_2_ * sVar10;
        uVar34 = auVar13._14_2_ * sVar12;
        uVar14 = uVar14 + 0x80 + (uVar14 >> 8);
        auVar15._0_8_ =
             CONCAT26(uVar38 + 0x80 + (uVar38 >> 8),
                      CONCAT24(uVar37 + 0x80 + (uVar37 >> 8),
                               CONCAT22(uVar14,uVar36 + 0x80 + (uVar36 >> 8))));
        auVar15._8_2_ = uVar39 + 0x80 + (uVar39 >> 8);
        auVar15._10_2_ = uVar40 + 0x80 + (uVar40 >> 8);
        auVar20._12_2_ = uVar41 + 0x80 + (uVar41 >> 8);
        auVar20._0_12_ = auVar15;
        auVar20._14_2_ = uVar42 + 0x80 + (uVar42 >> 8);
        auVar31._0_2_ = (ushort)(uVar22 + 0x80 + (uVar22 >> 8)) >> 8;
        auVar31._2_2_ = (ushort)(uVar23 + 0x80 + (uVar23 >> 8)) >> 8;
        auVar31._4_2_ = (ushort)(uVar24 + 0x80 + (uVar24 >> 8)) >> 8;
        auVar31._6_2_ = (ushort)(uVar25 + 0x80 + (uVar25 >> 8)) >> 8;
        auVar31._8_2_ = (ushort)(uVar26 + 0x80 + (uVar26 >> 8)) >> 8;
        auVar31._10_2_ = (ushort)(uVar27 + 0x80 + (uVar27 >> 8)) >> 8;
        auVar31._12_2_ = (ushort)(uVar28 + 0x80 + (uVar28 >> 8)) >> 8;
        auVar31._14_2_ = (ushort)(uVar34 + 0x80 + (uVar34 >> 8)) >> 8;
        auVar31 = auVar20 & auVar2 | auVar31;
        uVar14 = uVar14 >> 8;
        auVar21._2_2_ = 0;
        auVar21._0_2_ = uVar14;
        auVar21._4_4_ = (uint)((ulong)auVar15._0_8_ >> 0x38);
        auVar21._8_4_ = auVar15._8_4_ >> 0x18;
        auVar21._12_4_ = auVar20._12_4_ >> 0x18;
        auVar13._2_4_ = auVar21._4_4_ << 0x10;
        auVar13._0_2_ = uVar14;
        auVar13._6_4_ = auVar21._8_4_ << 0x10;
        auVar13._10_4_ = auVar21._12_4_ << 0x10;
        auVar13._14_2_ = 0;
        auVar16 = (auVar13 << 0x10 | auVar21) ^ auVar1;
        auVar13 = *pauVar9;
        uVar34 = (auVar13._0_2_ >> 8) * auVar16._0_2_;
        uVar36 = (auVar13._2_2_ >> 8) * auVar16._2_2_;
        uVar37 = (auVar13._4_2_ >> 8) * auVar16._4_2_;
        uVar38 = (auVar13._6_2_ >> 8) * auVar16._6_2_;
        uVar39 = (auVar13._8_2_ >> 8) * auVar16._8_2_;
        uVar40 = (auVar13._10_2_ >> 8) * auVar16._10_2_;
        uVar41 = (auVar13._12_2_ >> 8) * auVar16._12_2_;
        uVar42 = (auVar13._14_2_ >> 8) * auVar16._14_2_;
        auVar13 = auVar13 & auVar1;
        uVar14 = auVar13._0_2_ * auVar16._0_2_;
        uVar22 = auVar13._2_2_ * auVar16._2_2_;
        uVar23 = auVar13._4_2_ * auVar16._4_2_;
        uVar24 = auVar13._6_2_ * auVar16._6_2_;
        uVar25 = auVar13._8_2_ * auVar16._8_2_;
        uVar26 = auVar13._10_2_ * auVar16._10_2_;
        uVar27 = auVar13._12_2_ * auVar16._12_2_;
        uVar28 = auVar13._14_2_ * auVar16._14_2_;
        auVar32._0_2_ = uVar34 + 0x80 + (uVar34 >> 8);
        auVar32._2_2_ = uVar36 + 0x80 + (uVar36 >> 8);
        auVar32._4_2_ = uVar37 + 0x80 + (uVar37 >> 8);
        auVar32._6_2_ = uVar38 + 0x80 + (uVar38 >> 8);
        auVar32._8_2_ = uVar39 + 0x80 + (uVar39 >> 8);
        auVar32._10_2_ = uVar40 + 0x80 + (uVar40 >> 8);
        auVar32._12_2_ = uVar41 + 0x80 + (uVar41 >> 8);
        auVar32._14_2_ = uVar42 + 0x80 + (uVar42 >> 8);
        auVar33._0_2_ = (ushort)(uVar14 + 0x80 + (uVar14 >> 8)) >> 8;
        auVar33._2_2_ = (ushort)(uVar22 + 0x80 + (uVar22 >> 8)) >> 8;
        auVar33._4_2_ = (ushort)(uVar23 + 0x80 + (uVar23 >> 8)) >> 8;
        auVar33._6_2_ = (ushort)(uVar24 + 0x80 + (uVar24 >> 8)) >> 8;
        auVar33._8_2_ = (ushort)(uVar25 + 0x80 + (uVar25 >> 8)) >> 8;
        auVar33._10_2_ = (ushort)(uVar26 + 0x80 + (uVar26 >> 8)) >> 8;
        auVar33._12_2_ = (ushort)(uVar27 + 0x80 + (uVar27 >> 8)) >> 8;
        auVar33._14_2_ = (ushort)(uVar28 + 0x80 + (uVar28 >> 8)) >> 8;
        auVar33 = auVar32 & auVar2 | auVar33;
        (*pauVar9)[0] = auVar33[0] + auVar31[0];
        (*pauVar9)[1] = auVar33[1] + auVar31[1];
        (*pauVar9)[2] = auVar33[2] + auVar31[2];
        (*pauVar9)[3] = auVar33[3] + auVar31[3];
        (*pauVar9)[4] = auVar33[4] + auVar31[4];
        (*pauVar9)[5] = auVar33[5] + auVar31[5];
        (*pauVar9)[6] = auVar33[6] + auVar31[6];
        (*pauVar9)[7] = auVar33[7] + auVar31[7];
        (*pauVar9)[8] = auVar33[8] + auVar31[8];
        (*pauVar9)[9] = auVar33[9] + auVar31[9];
        (*pauVar9)[10] = auVar33[10] + auVar31[10];
        (*pauVar9)[0xb] = auVar33[0xb] + auVar31[0xb];
        (*pauVar9)[0xc] = auVar33[0xc] + auVar31[0xc];
        (*pauVar9)[0xd] = auVar33[0xd] + auVar31[0xd];
        (*pauVar9)[0xe] = auVar33[0xe] + auVar31[0xe];
        (*pauVar9)[0xf] = auVar33[0xf] + auVar31[0xf];
      }
      pauVar9 = pauVar9 + 1;
    }
    uVar5 = 0;
    for (; (uVar5 < 3 && ((long)uVar8 < (long)uVar7)); uVar8 = uVar8 + 1) {
      blend_pixel((quint32 *)pauVar9,srcPixels[uVar8],const_alpha);
      uVar5 = uVar5 + 1;
      pauVar9 = (undefined1 (*) [16])(*pauVar9 + 4);
    }
  }
  return;
}

Assistant:

void QT_FASTCALL comp_func_SourceOver_sse2(uint *destPixels, const uint *srcPixels, int length, uint const_alpha)
{
    Q_ASSERT(const_alpha < 256);

    const quint32 *src = (const quint32 *) srcPixels;
    quint32 *dst = (quint32 *) destPixels;

    const __m128i nullVector = _mm_set1_epi32(0);
    const __m128i half = _mm_set1_epi16(0x80);
    const __m128i one = _mm_set1_epi16(0xff);
    const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);
    if (const_alpha == 255) {
        const __m128i alphaMask = _mm_set1_epi32(0xff000000);
        BLEND_SOURCE_OVER_ARGB32_SSE2(dst, src, length, nullVector, half, one, colorMask, alphaMask);
    } else {
        const __m128i constAlphaVector = _mm_set1_epi16(const_alpha);
        BLEND_SOURCE_OVER_ARGB32_WITH_CONST_ALPHA_SSE2(dst, src, length, nullVector, half, one, colorMask, constAlphaVector);
    }
}